

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O3

bool Assimp::MDL::HalfLife::HL1MDLLoader::get_num_blend_controllers
               (int num_blend_animations,int *num_blend_controllers)

{
  uint uVar1;
  Logger *this;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (num_blend_animations == 4) {
    *num_blend_controllers = 2;
  }
  else if (num_blend_animations == 2) {
    *num_blend_controllers = 1;
  }
  else {
    if (num_blend_animations != 1) {
      *num_blend_controllers = 0;
      this = DefaultLogger::get();
      __val = -num_blend_animations;
      if (0 < num_blend_animations) {
        __val = num_blend_animations;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar1 = 4;
        do {
          __len = uVar1;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            __len = __len - 2;
            goto LAB_00484dc7;
          }
          if (uVar3 < 1000) {
            __len = __len - 1;
            goto LAB_00484dc7;
          }
          if (uVar3 < 10000) goto LAB_00484dc7;
          uVar5 = uVar5 / 10000;
          uVar1 = __len + 4;
        } while (99999 < uVar3);
        __len = __len + 1;
      }
LAB_00484dc7:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct
                ((ulong)local_50,(char)__len - (char)(num_blend_animations >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)num_blend_animations >> 0x1f) + (long)local_50[0]),__len,
                 __val);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x6c9e0c);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_80 = *plVar4;
        lStack_78 = plVar2[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        local_90 = (long *)*plVar2;
      }
      local_88 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar2;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Logger::warn(this,(char *)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return false;
    }
    *num_blend_controllers = 0;
  }
  return true;
}

Assistant:

bool HL1MDLLoader::get_num_blend_controllers(const int num_blend_animations, int &num_blend_controllers) {

    switch (num_blend_animations) {
        case SequenceBlendMode_HL1::NoBlend:
            num_blend_controllers = 0;
            return true;
        case SequenceBlendMode_HL1::TwoWayBlending:
            num_blend_controllers = 1;
            return true;
        case SequenceBlendMode_HL1::FourWayBlending:
            num_blend_controllers = 2;
            return true;
        default:
            num_blend_controllers = 0;
            ASSIMP_LOG_WARN(MDL_HALFLIFE_LOG_HEADER "Unsupported number of blend animations (" + std::to_string(num_blend_animations) + ")");
            return false;
    }
}